

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O0

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::Sort
          (PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  undefined1 local_38 [8];
  vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> runs;
  PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  runs.super__Vector_base<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::vector
            ((vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)local_38);
  GenerateRuns(this,begin,end,(vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)local_38);
  Merge(this,begin,(vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)local_38);
  std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::~vector
            ((vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *)local_38);
  return;
}

Assistant:

void Sort(RAI begin, RAI end) {
        std::vector<RunPool<ValueType>*> runs;
        GenerateRuns(begin, end, runs);
        Merge(begin, runs);
    }